

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_cptrapcc_32(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar4;
  uint uVar5;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = info->pc;
    uVar3 = (ulong)(uVar2 - (int)info->baseAddress & info->address_mask);
    uVar5 = 0x2a;
    if (uVar3 + 2 <= info->code_len) {
      uVar5 = info->code[uVar3 + 1] & 0x2f;
    }
    info->pc = uVar2 + 2;
    aVar4._0_4_ = peek_imm_32(info);
    info->pc = uVar2 + 6;
    MCInst_setOpcode(info->inst,0xee);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + uVar5;
    (info->extension).operands[0].type = M68K_OP_IMM;
    (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
    aVar4.reg_pair.reg_1 = 0;
    (info->extension).operands[0].field_0 = aVar4;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cptrapcc_32(m68k_info *info)
{
	uint extension1, extension2;
	cs_m68k* ext;
	cs_m68k_op* op0;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);
	extension2 = read_imm_32(info);

	ext = build_init_op(info, M68K_INS_FTRAPF, 1, 2);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);

	op0 = &ext->operands[0];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = extension2;
}